

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O0

int __thiscall rcg::Device::open(Device *this,char *__file,int __oflag,...)

{
  int extraout_EAX;
  element_type *peVar1;
  element_type *peVar2;
  void *pvVar3;
  mutex *__file_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  int __oflag_00;
  int __fd;
  GC_ERROR err;
  int i;
  DEVICE_ACCESS_FLAGS mode [3];
  lock_guard<std::mutex> lock;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_00000560;
  string *in_stack_00000568;
  GenTLException *in_stack_00000570;
  mutex_type *in_stack_ffffffffffffff48;
  lock_guard<std::mutex> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  __shared_ptr<GenApi_3_4::CEventAdapterGeneric,_(__gnu_cxx::_Lock_policy)2>
  *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff9c;
  int local_38;
  int local_34;
  undefined8 local_30;
  undefined4 local_28;
  int local_c;
  Device *local_8;
  
  local_c = (int)__file;
  __file_00 = &this->mtx;
  local_8 = this;
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  if (this->n_open == 0) {
    peVar1 = std::__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x11c3c1);
    Interface::open(peVar1,(char *)__file_00,__oflag_00);
    local_30 = 0x300000002;
    local_28 = 4;
    if (local_c == 0) {
      local_34 = 0;
    }
    else if (local_c == 1) {
      local_34 = 1;
    }
    else {
      local_34 = 2;
    }
    local_38 = -0x3eb;
    for (; __fd = (int)__file_00, local_38 == -0x3eb && local_34 < 3; local_34 = local_34 + 1) {
      peVar2 = std::
               __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x11c4a2);
      in_stack_ffffffffffffff60 =
           (__shared_ptr<GenApi_3_4::CEventAdapterGeneric,_(__gnu_cxx::_Lock_policy)2> *)
           peVar2->IFOpenDevice;
      peVar1 = std::__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x11c4bc);
      pvVar3 = Interface::getHandle(peVar1);
      __file_00 = (mutex *)std::__cxx11::string::c_str();
      in_stack_ffffffffffffff5c =
           (*(code *)in_stack_ffffffffffffff60)
                     (pvVar3,__file_00,*(undefined4 *)((long)&local_30 + (long)local_34 * 4),
                      &this->dev);
      local_38 = in_stack_ffffffffffffff5c;
    }
    this->event = (void *)0x0;
    std::__shared_ptr<GenApi_3_4::CEventAdapterGeneric,_(__gnu_cxx::_Lock_policy)2>::reset
              (in_stack_ffffffffffffff60);
    if (local_38 != 0) {
      peVar1 = std::__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x11c55f);
      Interface::close(peVar1,__fd);
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x28);
      std::__cxx11::to_string(in_stack_ffffffffffffff9c);
      std::operator+((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),__rhs);
      GenTLException::GenTLException(in_stack_00000570,in_stack_00000568,in_stack_00000560);
      __cxa_throw(__rhs,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
  }
  this->n_open = this->n_open + 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x11c66a);
  return extraout_EAX;
}

Assistant:

void Device::open(ACCESS access)
{
  std::lock_guard<std::mutex> lock(mtx);

  if (n_open == 0)
  {
    parent->open();

    // convert access mode to GenTL flags

    GenTL::DEVICE_ACCESS_FLAGS mode[]={GenTL::DEVICE_ACCESS_READONLY,
      GenTL::DEVICE_ACCESS_CONTROL, GenTL::DEVICE_ACCESS_EXCLUSIVE};

    int i=0;
    switch (access)
    {
      case READONLY:
        i=0;
        break;

      case CONTROL:
        i=1;
        break;

      default:
      case EXCLUSIVE:
        i=2;
        break;
    }

    // open device (if readonly fails, try control; if control fails try
    // exclusive)

    GenTL::GC_ERROR err = GenTL::GC_ERR_NOT_IMPLEMENTED;
    while (err == GenTL::GC_ERR_NOT_IMPLEMENTED && i < 3)
    {
      err=gentl->IFOpenDevice(parent->getHandle(), id.c_str(), mode[i], &dev);
      i++;
    }

    event=0;
    eventadapter.reset();

    // check if open was successful

    if (err != GenTL::GC_ERR_SUCCESS)
    {
      parent->close();
      throw GenTLException("Device::open() failed: "+std::to_string(err), gentl);
    }
  }

  n_open++;
}